

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

DecodeStatus
DecodeMSA128BRegisterClass(MCInst *Inst,uint RegNo,uint64_t Address,MCRegisterInfo *Decoder)

{
  uint Reg_00;
  uint in_ESI;
  MCInst *in_RDI;
  uint Reg;
  uint in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 local_4;
  
  if (in_ESI < 0x20) {
    Reg_00 = getReg((MCRegisterInfo *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    MCOperand_CreateReg0(in_RDI,Reg_00);
    local_4 = MCDisassembler_Success;
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeMSA128BRegisterClass(MCInst *Inst,
		unsigned RegNo, uint64_t Address, const MCRegisterInfo *Decoder)
{
	unsigned Reg;

	if (RegNo > 31)
		return MCDisassembler_Fail;

	Reg = getReg(Decoder, Mips_MSA128BRegClassID, RegNo);
	MCOperand_CreateReg0(Inst, Reg);

	return MCDisassembler_Success;
}